

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_common.hpp
# Opt level: O3

string * __thiscall
spirv_cross::join<char_const(&)[2],spirv_cross::TypedID<(spirv_cross::Types)0>&,char_const(&)[12]>
          (string *__return_storage_ptr__,spirv_cross *this,char (*ts) [2],
          TypedID<(spirv_cross::Types)0> *ts_1,char (*ts_2) [12])

{
  StringStream<4096UL,_4096UL> stream;
  undefined1 local_1118 [4336];
  
  local_1118._4120_8_ = local_1118 + 0x1030;
  local_1118._16_8_ = 0;
  local_1118._0_8_ = (char *)0x0;
  local_1118._8_8_ = 0;
  local_1118._4128_8_ = 0;
  local_1118._4136_8_ = 8;
  StringStream<4096UL,_4096UL>::reset((StringStream<4096UL,_4096UL> *)local_1118);
  inner::
  join_helper<char_const(&)[2],spirv_cross::TypedID<(spirv_cross::Types)0>&,char_const(&)[12]>
            ((StringStream<4096UL,_4096UL> *)local_1118,(char (*) [2])this,
             (TypedID<(spirv_cross::Types)0> *)ts,(char (*) [12])ts_1);
  StringStream<4096ul,4096ul>::str_abi_cxx11_(__return_storage_ptr__,local_1118);
  StringStream<4096UL,_4096UL>::~StringStream((StringStream<4096UL,_4096UL> *)local_1118);
  return __return_storage_ptr__;
}

Assistant:

std::string join(Ts &&... ts)
{
	StringStream<> stream;
	inner::join_helper(stream, std::forward<Ts>(ts)...);
	return stream.str();
}